

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[10],unsigned_long_const&,char_const(&)[14]>
                   (string *__return_storage_ptr__,char (*a) [31],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [10],unsigned_long *args_1,char (*args_2) [14])

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_e0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  size_t local_78;
  char (*local_70) [10];
  undefined8 local_68;
  size_t local_60;
  string *local_58;
  cmAlphaNum *local_50;
  size_t local_48;
  char (*local_40) [14];
  undefined8 local_38;
  
  local_a8.first._M_len = strlen(*a);
  local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88 = (b->_M_dataplus)._M_p;
  local_90 = b->_M_string_length;
  local_80 = 0;
  local_a8.first._M_str = *a;
  local_78 = strlen(*args);
  local_68 = 0;
  local_70 = args;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_e0,*args_1);
  pcVar1 = (cmAlphaNum *)(local_e0 + 0x10);
  if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_e0._0_8_;
  }
  local_58 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_e0;
  if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_e0._0_8_;
  }
  local_60 = (pcVar1->View_)._M_len;
  local_50 = (cmAlphaNum *)local_e0._0_8_;
  local_48 = strlen(*args_2);
  local_38 = 0;
  views._M_len = 5;
  views._M_array = &local_a8;
  local_40 = args_2;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}